

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_mat * rf_mat_look_at(rf_mat *__return_storage_ptr__,rf_vec3 eye,rf_vec3 target,rf_vec3 up)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 in_stack_00000080 [64];
  
  fVar5 = eye.x - target.x;
  fVar6 = eye.y - target.y;
  fVar7 = eye.z - target.z;
  fVar2 = SQRT(fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6);
  uVar1 = -(uint)(fVar2 == 0.0);
  fVar3 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar2));
  fVar5 = fVar5 * fVar3;
  fVar6 = fVar6 * fVar3;
  fVar3 = fVar3 * fVar7;
  fVar8 = up.y * fVar3 - fVar6 * up.z;
  fVar4 = up.z * fVar5 - fVar3 * up.x;
  fVar7 = up.x * fVar6 - fVar5 * up.y;
  fVar2 = SQRT(fVar7 * fVar7 + fVar8 * fVar8 + fVar4 * fVar4);
  uVar1 = -(uint)(fVar2 == 0.0);
  fVar2 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar2));
  fVar8 = fVar8 * fVar2;
  fVar4 = fVar4 * fVar2;
  fVar2 = fVar2 * fVar7;
  fVar7 = fVar6 * fVar2 - fVar3 * fVar4;
  __return_storage_ptr__->m0 = fVar8;
  __return_storage_ptr__->m1 = fVar4;
  __return_storage_ptr__->m2 = fVar2;
  fVar9 = fVar3 * fVar8 - fVar2 * fVar5;
  fVar4 = fVar5 * fVar4 - fVar8 * fVar6;
  fVar2 = SQRT(fVar4 * fVar4 + fVar7 * fVar7 + fVar9 * fVar9);
  uVar1 = -(uint)(fVar2 == 0.0);
  fVar2 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar2));
  __return_storage_ptr__->m4 = fVar7 * fVar2;
  __return_storage_ptr__->m5 = fVar9 * fVar2;
  __return_storage_ptr__->m6 = fVar2 * fVar4;
  __return_storage_ptr__->m8 = fVar5;
  __return_storage_ptr__->m9 = fVar6;
  __return_storage_ptr__->m10 = fVar3;
  __return_storage_ptr__->m12 = eye.x;
  __return_storage_ptr__->m13 = eye.y;
  __return_storage_ptr__->m14 = eye.z;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  rf_mat_invert((rf_mat)in_stack_00000080);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mat rf_mat_look_at(rf_vec3 eye, rf_vec3 target, rf_vec3 up)
{
    rf_mat result = {0};

    rf_vec3 z = rf_vec3_sub(eye, target);
    z = rf_vec3_normalize(z);
    rf_vec3 x = rf_vec3_cross_product(up, z);
    x = rf_vec3_normalize(x);
    rf_vec3 y = rf_vec3_cross_product(z, x);
    y = rf_vec3_normalize(y);

    result.m0 = x.x;
    result.m1 = x.y;
    result.m2 = x.z;
    result.m3 = 0.0f;
    result.m4 = y.x;
    result.m5 = y.y;
    result.m6 = y.z;
    result.m7 = 0.0f;
    result.m8 = z.x;
    result.m9 = z.y;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = eye.x;
    result.m13 = eye.y;
    result.m14 = eye.z;
    result.m15 = 1.0f;

    result = rf_mat_invert(result);

    return result;
}